

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

void __thiscall branch_and_reduce_algorithm::dfs_root(branch_and_reduce_algorithm *this,int v)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  reference pvVar5;
  reference this_00;
  reference piVar6;
  reference __b;
  int *piVar7;
  iterator iStack_30;
  int u;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  int direct_children;
  int v_local;
  branch_and_reduce_algorithm *this_local;
  
  vVar1 = this->current_dfs_num;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->minNr,(long)v);
  *pvVar5 = vVar1;
  iVar2 = this->current_dfs_num;
  this->current_dfs_num = iVar2 + 1;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->visited,(long)v);
  *pvVar5 = iVar2;
  __range1._0_4_ = 0;
  this_00 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&this->adj,(long)v);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(this_00);
  iStack_30 = std::vector<int,_std::allocator<int>_>::end(this_00);
  while (bVar4 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0), bVar4) {
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    iVar2 = *piVar6;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
    if ((*pvVar5 < 0) &&
       (pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->visited,(long)iVar2),
       *pvVar5 < 0)) {
      __range1._0_4_ = (int)__range1 + 1;
      dfs(this,iVar2,v);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->minNr,(long)v);
      __b = std::vector<int,_std::allocator<int>_>::operator[](&this->minNr,(long)iVar2);
      piVar7 = std::min<int>(pvVar5,__b);
      iVar3 = *piVar7;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->minNr,(long)v);
      *pvVar5 = iVar3;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->minNr,(long)iVar2);
      iVar2 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->visited,(long)v);
      if (*pvVar5 <= iVar2) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->articulation_points,(long)v);
        *pvVar5 = 1;
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  if ((int)__range1 < 2) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->articulation_points,(long)v);
    *pvVar5 = 0;
  }
  return;
}

Assistant:

void branch_and_reduce_algorithm::dfs_root(int v)
{
    minNr[v] = current_dfs_num;
    visited[v] = current_dfs_num++;

    int direct_children = 0;

    for (int u : adj[v])
    {
        if (x[u] < 0 && visited[u] < 0) // tree edge
        {
            direct_children++;

            dfs(u, v);
            minNr[v] = min(minNr[v], minNr[u]);

            if (minNr[u] >= visited[v]) // cut vertex found
                articulation_points[v] = 1;
        }
        // else if (x[u] < 0) // backwards edge
        //     minNr[v] = min(minNr[v], visited[u]);
    }

    if (direct_children < 2) // root is no cut vertex
        articulation_points[v] = 0;
}